

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O0

void list_insert_before(list *list,list_elem *before,list_elem *e)

{
  list_elem *e_local;
  list_elem *before_local;
  list *list_local;
  
  e->prev = before->prev;
  e->next = before;
  if (before->prev == (list_elem *)0x0) {
    list->head = e;
  }
  else {
    before->prev->next = e;
  }
  before->prev = e;
  return;
}

Assistant:

void list_insert_before(struct list *list, struct list_elem *before, struct list_elem *e)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    e->prev = before->prev;
    e->next = before;
    if (before->prev) before->prev->next = e;
    else list->head = e;
    before->prev = e;
    IFDEF_LOCK( spin_unlock(&list->lock); );
}